

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<const_DomAction_*,_QString>::emplaceValue<QString>
          (Node<const_DomAction_*,_QString> *this,QString *args)

{
  qsizetype qVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  
  qVar1 = (args->d).size;
  (args->d).size = 0;
  pDVar3 = (args->d).d;
  pcVar4 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (char16_t *)0x0;
  pQVar2 = &((this->value).d.d)->super_QArrayData;
  (this->value).d.d = pDVar3;
  (this->value).d.ptr = pcVar4;
  (this->value).d.size = qVar1;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }